

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

RealType __thiscall OpenMD::Snapshot::getYZarea(Snapshot *this)

{
  Mat3x3d *this_00;
  RealType RVar1;
  Vector<double,_3U> VStack_68;
  Vector3d z;
  Vector3d y;
  
  if (this->hasYZarea == true) {
    RVar1 = (this->frameData).yzArea;
  }
  else {
    this_00 = &(this->frameData).hmat;
    RectMatrix<double,_3U,_3U>::getColumn
              (&z.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)this_00,1);
    Vector<double,_3U>::Vector(&y.super_Vector<double,_3U>,&z.super_Vector<double,_3U>);
    RectMatrix<double,_3U,_3U>::getColumn(&VStack_68,(RectMatrix<double,_3U,_3U> *)this_00,2);
    Vector<double,_3U>::Vector(&z.super_Vector<double,_3U>,&VStack_68);
    cross<double>((Vector3<double> *)&VStack_68,(Vector3<double> *)&y.super_Vector<double,_3U>,
                  (Vector3<double> *)&z.super_Vector<double,_3U>);
    RVar1 = Vector<double,_3U>::length(&VStack_68);
    (this->frameData).yzArea = RVar1;
    this->hasYZarea = true;
  }
  return RVar1;
}

Assistant:

RealType Snapshot::getYZarea() {
    if (!hasYZarea) {
      Vector3d y       = frameData.hmat.getColumn(1);
      Vector3d z       = frameData.hmat.getColumn(2);
      frameData.yzArea = cross(y, z).length();
      hasYZarea        = true;
    }
    return frameData.yzArea;
  }